

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall VariationalBayesEstimatorOnLDA::updateNEx(VariationalBayesEstimatorOnLDA *this)

{
  double dVar1;
  value_type vVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  ulong uVar6;
  reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  uint local_98;
  uint local_94;
  int v_1;
  int k_3;
  int k_2;
  int d_2;
  int k_1;
  uint v;
  int l;
  int d_1;
  int local_6c;
  value_type_conflict vStack_68;
  int d;
  int local_60;
  allocator<std::vector<double,_std::allocator<double>_>_> local_59;
  int k;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ndkBuf;
  allocator<std::vector<double,_std::allocator<double>_>_> local_29;
  undefined1 local_28 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  nkvBuf;
  VariationalBayesEstimatorOnLDA *this_local;
  
  nkvBuf.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  sVar5 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->_nkv);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_29);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_28,sVar5,&local_29);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_29);
  sVar5 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->_ndk);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_59);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&k,sVar5,&local_59);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_59);
  local_60 = 0;
  while( true ) {
    uVar6 = (ulong)local_60;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_nkv);
    if (sVar5 <= uVar6) break;
    pvVar7 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_28,(long)local_60);
    vStack_68 = 0.0;
    std::vector<double,_std::allocator<double>_>::assign
              (pvVar7,(ulong)this->_V,&stack0xffffffffffffff98);
    local_60 = local_60 + 1;
  }
  local_6c = 0;
  while( true ) {
    uVar6 = (ulong)local_6c;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_ndk);
    if (sVar5 <= uVar6) break;
    pvVar7 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&k,(long)local_6c);
    _l = 0.0;
    std::vector<double,_std::allocator<double>_>::assign
              (pvVar7,(ulong)this->_K,(value_type_conflict *)&l);
    local_6c = local_6c + 1;
  }
  v = 0;
  while( true ) {
    sVar5 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(this->_docVoca);
    if (sVar5 <= (ulong)(long)(int)v) break;
    k_1 = 0;
    while( true ) {
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->_docVoca,(long)(int)v);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
      if (sVar5 <= (ulong)(long)k_1) break;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->_docVoca,(long)(int)v);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar8,(long)k_1);
      uVar3 = *pvVar9;
      for (k_2 = 0; (uint)k_2 < this->_K; k_2 = k_2 + 1) {
        pvVar10 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::operator[](&this->_qz,(long)(int)v);
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar10,(long)k_1);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)k_2);
        dVar1 = *pvVar11;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](this->_frequencyMatrix,(long)(int)v);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar8,(ulong)uVar3);
        uVar4 = *pvVar9;
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&k,(long)(int)v);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)k_2);
        *pvVar11 = dVar1 * (double)uVar4 + *pvVar11;
        pvVar10 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::operator[](&this->_qz,(long)(int)v);
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar10,(long)k_1);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)k_2);
        dVar1 = *pvVar11;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](this->_frequencyMatrix,(long)(int)v);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar8,(ulong)uVar3);
        uVar4 = *pvVar9;
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_28,(long)k_2);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(ulong)uVar3);
        *pvVar11 = dVar1 * (double)uVar4 + *pvVar11;
      }
      k_1 = k_1 + 1;
    }
    v = v + 1;
  }
  for (k_3 = 0; (uint)k_3 < this->_D; k_3 = k_3 + 1) {
    for (v_1 = 0; (uint)v_1 < this->_K; v_1 = v_1 + 1) {
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&k,(long)k_3);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)v_1);
      vVar2 = *pvVar11;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_ndk,(long)k_3);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)v_1);
      *pvVar11 = vVar2;
    }
  }
  for (local_94 = 0; local_94 < this->_K; local_94 = local_94 + 1) {
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        (&this->_nk,(long)(int)local_94);
    *pvVar11 = 0.0;
    for (local_98 = 0; local_98 < this->_V; local_98 = local_98 + 1) {
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)local_28,(long)(int)local_94);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)(int)local_98)
      ;
      vVar2 = *pvVar11;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_nkv,(long)(int)local_94);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)(int)local_98)
      ;
      *pvVar11 = vVar2;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)local_28,(long)(int)local_94);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)(int)local_98)
      ;
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&this->_nk,(long)(int)local_94);
      *pvVar11 = dVar1 + *pvVar11;
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&k);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_28);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateNEx(){//{{{
    vector<vector<double> > nkvBuf(_nkv.size()), ndkBuf(_ndk.size());
    for(int k=0;k<_nkv.size();k++)nkvBuf[k].assign(_V, 0);
    for(int d=0;d<_ndk.size();d++)ndkBuf[d].assign(_K, 0);
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                ndkBuf[d][k] += _qz[d][l][k] * _frequencyMatrix[d][v];
                nkvBuf[k][v] += _qz[d][l][k] * _frequencyMatrix[d][v];
            }
        }
    }
    for(int d=0;d<_D;d++){
        for(int k=0;k<_K;k++){
            _ndk[d][k] = ndkBuf[d][k];
        }
    }
    for(int k=0;k<_K;k++){
        _nk[k] = 0;
        for(int v=0;v<_V;v++){
            _nkv[k][v] = nkvBuf[k][v];
            _nk[k] += nkvBuf[k][v];
        }
    }

}